

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::is_canonically_normalizing_value(Value *value)

{
  bool bVar1;
  CallInst *this;
  Value *value_00;
  undefined1 local_11;
  Value *value_local;
  
  bVar1 = value_is_dx_op_instrinsic(value,Rsqrt);
  local_11 = false;
  if (bVar1) {
    this = LLVMBC::cast<LLVMBC::CallInst>(value);
    value_00 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
    local_11 = value_is_length_squared(value_00);
  }
  return local_11;
}

Assistant:

static bool is_canonically_normalizing_value(const llvm::Value *value)
{
	return value_is_dx_op_instrinsic(value, DXIL::Op::Rsqrt) &&
	       value_is_length_squared(llvm::cast<llvm::CallInst>(value)->getOperand(1));
}